

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O3

void __thiscall
duckdb::NotImplementedException::NotImplementedException<duckdb_libpgquery::PGBoolTestType>
          (NotImplementedException *this,string *msg,PGBoolTestType params)

{
  string local_30;
  
  Exception::ConstructMessage<duckdb_libpgquery::PGBoolTestType>(&local_30,msg,params);
  NotImplementedException(this,(string *)&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return;
}

Assistant:

explicit NotImplementedException(const string &msg, ARGS... params)
	    : NotImplementedException(ConstructMessage(msg, params...)) {
	}